

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrackJamTargetIdentifier.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::TrackJamTargetIdentifier::Encode
          (TrackJamTargetIdentifier *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  TrackJamTargetIdentifier *this_local;
  
  pKVar1 = KDataStream::operator<<
                     (stream,(this->super_EntityIdentifier).super_SimulationIdentifier.m_ui16SiteID)
  ;
  pKVar1 = KDataStream::operator<<
                     (pKVar1,(this->super_EntityIdentifier).super_SimulationIdentifier.
                             m_ui16ApplicationID);
  pKVar1 = KDataStream::operator<<
                     (pKVar1,*(unsigned_short *)
                              &(this->super_EntityIdentifier).super_SimulationIdentifier.field_0xc);
  pKVar1 = KDataStream::operator<<
                     (pKVar1,(this->super_EntityIdentifier).super_SimulationIdentifier.field_0xe);
  KDataStream::operator<<
            (pKVar1,(this->super_EntityIdentifier).super_SimulationIdentifier.field_0xf);
  return;
}

Assistant:

void TrackJamTargetIdentifier::Encode( KDataStream & stream ) const
{
    stream << m_ui16SiteID
           << m_ui16ApplicationID
           << m_ui16EntityID
           << m_ui8EmitterID
           << m_ui8BeamID;
}